

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O3

int Wln_RetCheckBackward(Wln_Ret_t *p,Vec_Int_t *vSet)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  int *piVar6;
  Wln_Ntk_t *pWVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  if (0 < vSet->nSize) {
    pWVar7 = p->pNtk;
    lVar11 = 0;
    do {
      iVar1 = vSet->pArray[lVar11];
      lVar12 = (long)iVar1;
      if ((lVar12 < 0) || ((pWVar7->vRefs).nSize <= iVar1)) {
LAB_0038bb9b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((pWVar7->vRefs).pArray[lVar12] == 0) {
        return 0;
      }
      iVar8 = -1;
      lVar9 = 0;
      while (lVar9 < (pWVar7->vRefs).pArray[lVar12]) {
        uVar5 = (p->vFanouts).nSize;
        if ((int)uVar5 <= iVar1) goto LAB_0038bb9b;
        piVar6 = (p->vFanouts).pArray;
        lVar10 = (long)piVar6[lVar12];
        if ((lVar10 < 0) || (uVar5 <= (uint)piVar6[lVar12])) {
LAB_0038bbba:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        iVar2 = piVar6[lVar10 + lVar9 * 2 + 1];
        if (((long)iVar2 < 0) || ((p->vFanins).nSize <= iVar2)) goto LAB_0038bbba;
        piVar4 = (p->vFanins).pArray;
        if (piVar4 == (int *)0x0) break;
        if (piVar6[lVar10 + lVar9 * 2] != 0) {
          piVar4 = piVar4 + iVar2;
          if (*piVar4 == 0) {
            return 0;
          }
          piVar6 = Wln_RetHeadToTail(p,piVar4);
          if ((*piVar6 < -1) || (uVar5 = *piVar6 + 1, (p->vEdgeLinks).nSize <= (int)uVar5))
          goto LAB_0038bb9b;
          iVar2 = (p->vEdgeLinks).pArray[uVar5];
          lVar10 = (long)iVar2;
          if ((lVar10 < 0) || (pWVar7 = p->pNtk, (pWVar7->vTypes).nSize <= iVar2))
          goto LAB_0038bb9b;
          if ((pWVar7->vTypes).pArray[lVar10] != 0x59) {
            __assert_fail("Wln_ObjIsFf( p->pNtk, iFlop )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wln/wlnRetime.c"
                          ,0x18b,"int Wln_RetCheckBackwardOne(Wln_Ret_t *, int)");
          }
          iVar3 = (p->vFfClasses).nSize;
          if (iVar8 == -1) {
            if (iVar3 <= iVar2) goto LAB_0038bb9b;
            iVar8 = (p->vFfClasses).pArray[lVar10];
          }
          else {
            if (iVar3 <= iVar2) goto LAB_0038bb9b;
            if (iVar8 != (p->vFfClasses).pArray[lVar10]) {
              return 0;
            }
          }
        }
        lVar9 = lVar9 + 1;
        if ((pWVar7->vRefs).nSize <= iVar1) goto LAB_0038bb9b;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < vSet->nSize);
  }
  return 1;
}

Assistant:

int Wln_RetCheckBackward( Wln_Ret_t * p, Vec_Int_t * vSet )
{
    int i, iObj;
    Vec_IntForEachEntry( vSet, iObj, i )
        if ( !Wln_RetCheckBackwardOne( p, iObj ) )
            return 0;
    return 1;
}